

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldResponseNackPdu.cpp
# Opt level: O2

bool __thiscall
DIS::MinefieldResponseNackPdu::operator==
          (MinefieldResponseNackPdu *this,MinefieldResponseNackPdu *rhs)

{
  pointer pEVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_t idx;
  ulong uVar5;
  long lVar6;
  
  bVar2 = MinefieldFamilyPdu::operator==
                    (&this->super_MinefieldFamilyPdu,&rhs->super_MinefieldFamilyPdu);
  bVar3 = EntityID::operator==(&this->_minefieldID,&rhs->_minefieldID);
  bVar4 = EntityID::operator==(&this->_requestingEntityID,&rhs->_requestingEntityID);
  bVar2 = this->_requestID == rhs->_requestID && (bVar4 && (bVar3 && bVar2));
  lVar6 = 0;
  for (uVar5 = 0;
      pEVar1 = (this->_missingPduSequenceNumbers).
               super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_missingPduSequenceNumbers).
                            super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 4);
      uVar5 = uVar5 + 1) {
    bVar3 = EightByteChunk::operator==
                      ((EightByteChunk *)(pEVar1->_otherParameters + lVar6 + -8),
                       (EightByteChunk *)
                       (((rhs->_missingPduSequenceNumbers).
                         super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_otherParameters + lVar6 + -8))
    ;
    bVar2 = (bool)(bVar2 & bVar3);
    lVar6 = lVar6 + 0x10;
  }
  return bVar2;
}

Assistant:

bool MinefieldResponseNackPdu::operator ==(const MinefieldResponseNackPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = MinefieldFamilyPdu::operator==(rhs);

     if( ! (_minefieldID == rhs._minefieldID) ) ivarsEqual = false;
     if( ! (_requestingEntityID == rhs._requestingEntityID) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _missingPduSequenceNumbers.size(); idx++)
     {
        if( ! ( _missingPduSequenceNumbers[idx] == rhs._missingPduSequenceNumbers[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }